

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O2

void __thiscall tt::net::Epoll::Epoll(Epoll *this)

{
  int iVar1;
  allocator_type local_29;
  
  iVar1 = epoll_create1(0x80000);
  this->m_epollFd = iVar1;
  std::vector<epoll_event,_std::allocator<epoll_event>_>::vector(&this->m_events,0x1000,&local_29);
  memset(this->m_fd2chan,0,3200000);
  TimerManager::TimerManager(&this->m_timeManager);
  if (0 < this->m_epollFd) {
    return;
  }
  __assert_fail("m_epollFd > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/Epoll.cc"
                ,0x1b,"tt::net::Epoll::Epoll()");
}

Assistant:

Epoll::Epoll()
	:m_epollFd(epoll_create1(EPOLL_CLOEXEC)),
	m_events(EVENTSNUM){
	
	assert(m_epollFd > 0);	
}